

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O0

WaitResult<bool>
Wait<bool,EnsureNoUserDataCallable>
          (long timeout,long sleep_timeout,EnsureNoUserDataCallable *callable)

{
  WaitResult<bool> WVar1;
  long lVar2;
  long lVar3;
  WaitResult<bool> local_3c;
  long cur_time;
  long start_time;
  EnsureNoUserDataCallable *callable_local;
  long sleep_timeout_local;
  long timeout_local;
  WaitResult<bool> result;
  
  lVar2 = udpdiscovery::impl::NowTime();
  do {
    WVar1 = EnsureNoUserDataCallable::operator()(callable);
    timeout_local._5_2_ = WVar1._0_2_;
    timeout_local._7_1_ = WVar1.result;
    if (((uint3)WVar1 & 0x100) != 0) goto LAB_00110890;
    udpdiscovery::impl::SleepFor(sleep_timeout);
    lVar3 = udpdiscovery::impl::NowTime();
  } while (lVar3 - lVar2 <= timeout);
  WaitResult<bool>::WaitResult((WaitResult<bool> *)((long)&timeout_local + 5));
  timeout_local._5_2_ = CONCAT11(timeout_local._6_1_,1);
LAB_00110890:
  local_3c.result = (bool)timeout_local._7_1_;
  local_3c.is_timeout = (bool)timeout_local._5_1_;
  local_3c.has_result = (bool)timeout_local._6_1_;
  return local_3c;
}

Assistant:

WaitResult<ResultType> Wait(long timeout, long sleep_timeout,
                            Callable callable) {
  long start_time = udpdiscovery::impl::NowTime();
  while (true) {
    WaitResult<ResultType> result = callable();
    if (result.has_result) {
      return result;
    }

    udpdiscovery::impl::SleepFor(sleep_timeout);

    long cur_time = udpdiscovery::impl::NowTime();
    if ((cur_time - start_time) > timeout) {
      break;
    }
  }

  WaitResult<ResultType> result;
  result.is_timeout = true;

  return result;
}